

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGforStageCreation.cpp
# Opt level: O0

void __thiscall
BGforStageCreation::Fill_jaI_Array
          (BGforStageCreation *this,PlanningUnitMADPDiscrete *pu,Index ts,Index *joIs,
          shared_ptr<const_JointPolicyDiscretePure> *jpolPrevTs,Index *jaI_arr)

{
  int iVar1;
  type pJVar2;
  uint in_EDX;
  shared_ptr<const_JointPolicyDiscretePure> *in_R8;
  long in_R9;
  Index unaff_retaddr;
  Index unaff_retaddr_00;
  Index next_joI;
  Index ja;
  Index t;
  Index johI;
  uint local_38;
  uint local_34;
  
  local_34 = 0;
  for (local_38 = 0; local_38 < in_EDX; local_38 = local_38 + 1) {
    pJVar2 = boost::shared_ptr<const_JointPolicyDiscretePure>::operator->(in_R8);
    iVar1 = (*(pJVar2->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x11])
                      (pJVar2,(ulong)local_34);
    *(int *)(in_R9 + (ulong)local_38 * 4) = iVar1;
    local_34 = PlanningUnitMADPDiscrete::GetSuccessorJOHI(_next_joI,unaff_retaddr_00,unaff_retaddr);
  }
  return;
}

Assistant:

void BGforStageCreation::Fill_jaI_Array(
        const PlanningUnitMADPDiscrete* pu,
        Index ts, 
        Index joIs[], //the array of joint observations issued 
        const boost::shared_ptr<const JointPolicyDiscretePure> &jpolPrevTs, 
        Index* jaI_arr
        )
{
    Index johI = 0;
    Index t = 0;
    while(t < ts)
    {
        Index ja = jpolPrevTs->GetJointActionIndex(johI);
        jaI_arr[t] = ja;

        Index next_joI = joIs[t];
        johI = pu->GetSuccessorJOHI(johI, next_joI);
        t++;
    }
}